

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Usage: ",7);
  if (program_name == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar1 = strlen(program_name);
    std::__ostream_insert<char,std::char_traits<char>>(stream,program_name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," imagefile [imagefile ...]\n",0x1b);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               "\nRead exr files and print the values of header attributes.\n\nOptions:\n  -h, --help        print this message\n      --version     print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
               ,0x105);
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " imagefile [imagefile ...]\n";

    if (verbose)
        stream << "\n"
            "Read exr files and print the values of header attributes.\n"
            "\n"
            "Options:\n"
            "  -h, --help        print this message\n"
            "      --version     print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}